

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndComboPreview(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImDrawCmd *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiWindow_conflict *pIVar8;
  ImDrawList *this;
  ImDrawCmd *pIVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiContext_conflict1 *pIVar14;
  long lVar15;
  uint uVar16;
  ImVec2 IVar17;
  
  pIVar14 = GImGui;
  pIVar8 = GImGui->CurrentWindow;
  fVar4 = (GImGui->ComboPreviewData).PreviewRect.Max.x;
  pIVar1 = &(pIVar8->DC).CursorMaxPos;
  if ((pIVar1->x <= fVar4 && fVar4 != pIVar1->x) &&
     (fVar4 = (GImGui->ComboPreviewData).PreviewRect.Max.y, pfVar2 = &(pIVar8->DC).CursorMaxPos.y,
     *pfVar2 <= fVar4 && fVar4 != *pfVar2)) {
    this = pIVar8->DrawList;
    lVar15 = (long)(this->CmdBuffer).Size;
    if (1 < lVar15) {
      pIVar9 = (this->CmdBuffer).Data;
      pIVar3 = pIVar9 + lVar15 + -2;
      uVar10 = (pIVar3->ClipRect).x;
      uVar11 = (pIVar3->ClipRect).y;
      uVar12 = (pIVar3->ClipRect).z;
      uVar13 = (pIVar3->ClipRect).w;
      pIVar9 = pIVar9 + lVar15 + -1;
      (pIVar9->ClipRect).x = (float)uVar10;
      (pIVar9->ClipRect).y = (float)uVar11;
      (pIVar9->ClipRect).z = (float)uVar12;
      (pIVar9->ClipRect).w = (float)uVar13;
      (this->_CmdHeader).ClipRect.x = (float)uVar10;
      (this->_CmdHeader).ClipRect.y = (float)uVar11;
      (this->_CmdHeader).ClipRect.z = (float)uVar12;
      (this->_CmdHeader).ClipRect.w = (float)uVar13;
      ImDrawList::_TryMergeDrawCmds(this);
    }
  }
  PopClipRect();
  (pIVar8->DC).CursorPos = (pIVar14->ComboPreviewData).BackupCursorPos;
  fVar4 = (pIVar8->DC).CursorMaxPos.x;
  fVar5 = (pIVar8->DC).CursorMaxPos.y;
  fVar6 = (pIVar14->ComboPreviewData).BackupCursorMaxPos.x;
  fVar7 = (pIVar14->ComboPreviewData).BackupCursorMaxPos.y;
  uVar16 = -(uint)(fVar6 <= fVar4);
  IVar17.x = (float)(~uVar16 & (uint)fVar6 | (uint)fVar4 & uVar16);
  uVar16 = -(uint)(fVar7 <= fVar5);
  IVar17.y = (float)(~uVar16 & (uint)fVar7 | (uint)fVar5 & uVar16);
  (pIVar8->DC).CursorMaxPos = IVar17;
  (pIVar8->DC).CursorPosPrevLine = (pIVar14->ComboPreviewData).BackupCursorPosPrevLine;
  (pIVar8->DC).PrevLineTextBaseOffset = (pIVar14->ComboPreviewData).BackupPrevLineTextBaseOffset;
  (pIVar8->DC).LayoutType = (pIVar14->ComboPreviewData).BackupLayout;
  (pIVar14->ComboPreviewData).PreviewRect.Min.x = 0.0;
  (pIVar14->ComboPreviewData).PreviewRect.Min.y = 0.0;
  (pIVar14->ComboPreviewData).PreviewRect.Max.x = 0.0;
  (pIVar14->ComboPreviewData).PreviewRect.Max.y = 0.0;
  return;
}

Assistant:

void ImGui::EndComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    // FIXME: Using CursorMaxPos approximation instead of correct AABB which we will store in ImDrawCmd in the future
    ImDrawList* draw_list = window->DrawList;
    if (window->DC.CursorMaxPos.x < preview_data->PreviewRect.Max.x && window->DC.CursorMaxPos.y < preview_data->PreviewRect.Max.y)
        if (draw_list->CmdBuffer.Size > 1) // Unlikely case that the PushClipRect() didn't create a command
        {
            draw_list->_CmdHeader.ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 2].ClipRect;
            draw_list->_TryMergeDrawCmds();
        }
    PopClipRect();
    window->DC.CursorPos = preview_data->BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, preview_data->BackupCursorMaxPos);
    window->DC.CursorPosPrevLine = preview_data->BackupCursorPosPrevLine;
    window->DC.PrevLineTextBaseOffset = preview_data->BackupPrevLineTextBaseOffset;
    window->DC.LayoutType = preview_data->BackupLayout;
    preview_data->PreviewRect = ImRect();
}